

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *
make_word<char16_t,std::__cxx11::u16string>
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,size_t length,char16_t delim)

{
  char16_t local_3a;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_3a = delim;
  std::__cxx11::u16string::_M_construct<char16_t_const*>((u16string *)&local_38,&local_3a,&local_38)
  ;
  make_word<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_nullptr>
            (__return_storage_ptr__,&local_38,length);
  std::__cxx11::u16string::~u16string((u16string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}